

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QTransform * __thiscall
QGraphicsItemPrivate::genericMapFromSceneTransform(QGraphicsItemPrivate *this,QWidget *viewport)

{
  bool bVar1;
  long in_RDX;
  QGraphicsItemPrivate *in_RSI;
  QTransform *in_RDI;
  long in_FS_OFFSET;
  QGraphicsView *view;
  QGraphicsItem *q;
  QTransform viewportTransform;
  QGraphicsView *local_138;
  QTransform *in_stack_ffffffffffffff18;
  QGraphicsItem *in_stack_ffffffffffffff20;
  bool local_a8 [80];
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RSI);
  bVar1 = itemIsUntransformable(in_RSI);
  if (bVar1) {
    if (in_RDX == 0) {
      local_138 = (QGraphicsView *)0x0;
    }
    else {
      QWidget::parentWidget((QWidget *)0x971f83);
      local_138 = qobject_cast<QGraphicsView*>((QObject *)0x971f8b);
    }
    if (local_138 == (QGraphicsView *)0x0) {
      QTransform::inverted((bool *)in_RDI);
    }
    else {
      memcpy(local_58,&DAT_00b41bf8,0x50);
      QGraphicsView::viewportTransform(local_138);
      QGraphicsItem::deviceTransform(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      QTransform::inverted(local_a8);
      QTransform::operator*(in_RDI,(QTransform *)local_58);
    }
  }
  else {
    QTransform::inverted((bool *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QTransform QGraphicsItemPrivate::genericMapFromSceneTransform(const QWidget *viewport) const
{
    Q_Q(const QGraphicsItem);
    if (!itemIsUntransformable())
       return sceneTransform.inverted();
    const QGraphicsView *view = viewport
        ? qobject_cast<QGraphicsView *>(viewport->parentWidget())
        : nullptr;
    if (view == nullptr)
        return sceneTransform.inverted();
    // ### More ping pong than needed.
    const QTransform viewportTransform = view->viewportTransform();
    return viewportTransform * q->deviceTransform(viewportTransform).inverted();
}